

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Finalize<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,short *target,
               AggregateFinalizeData *finalize_data)

{
  short sVar1;
  FunctionData *pFVar2;
  reference q;
  idx_t n;
  Interpolator<true> interp;
  QuantileDirect<short> local_51;
  Interpolator<true> local_50;
  
  if ((state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar2 + 8),0);
    n = (long)(state->v).super_vector<short,_std::allocator<short>_>.
              super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(state->v).super_vector<short,_std::allocator<short>_>.
              super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
              _M_start >> 1;
    local_50.desc = *(bool *)(pFVar2 + 0x38);
    local_50.FRN = Interpolator<true>::Index(q,n);
    local_50.begin = 0;
    local_50.CRN = local_50.FRN;
    local_50.end = n;
    sVar1 = Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
                      (&local_50,
                       (state->v).super_vector<short,_std::allocator<short>_>.
                       super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start,finalize_data->result,&local_51);
    *target = sVar1;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}